

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  StkId pTVar1;
  GCObject *pGVar2;
  Value *pVVar3;
  int iVar4;
  int in_EDX;
  Node *in_RSI;
  lua_State *in_RDI;
  TValue *i_o;
  TValue *o1;
  TValue *o2;
  Closure *cl;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  undefined8 in_stack_ffffffffffffffc8;
  lua_State *in_stack_ffffffffffffffd0;
  int local_14;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_RDI->l_G->GCthreshold <= in_RDI->l_G->totalbytes) {
    luaC_step((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  iVar5 = in_EDX;
  getcurrenv(in_RDI);
  pGVar2 = (GCObject *)
           luaF_newCclosure(in_stack_ffffffffffffffd0,iVar4,
                            (Table *)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
  (pGVar2->h).node = in_RSI;
  in_RDI->top = in_RDI->top + -(long)in_EDX;
  local_14 = in_EDX;
  while (iVar4 = local_14 + -1, local_14 != 0) {
    pTVar1 = in_RDI->top;
    pVVar3 = (Value *)((long)pGVar2 + (long)iVar4 * 0x10 + 0x28);
    *pVVar3 = pTVar1[iVar4].value;
    pVVar3[1].b = pTVar1[iVar4].tt;
    local_14 = iVar4;
  }
  pTVar1 = in_RDI->top;
  (pTVar1->value).gc = pGVar2;
  pTVar1->tt = 6;
  in_RDI->top = in_RDI->top + 1;
  return;
}

Assistant:

static void lua_pushcclosure(lua_State*L,lua_CFunction fn,int n){
Closure*cl;
luaC_checkGC(L);
api_checknelems(L,n);
cl=luaF_newCclosure(L,n,getcurrenv(L));
cl->c.f=fn;
L->top-=n;
while(n--)
setobj(L,&cl->c.upvalue[n],L->top+n);
setclvalue(L,L->top,cl);
api_incr_top(L);
}